

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::EmptyWorkloadReferenceCase::writeWorkload
          (EmptyWorkloadReferenceCase *this,ostringstream *dst,char *resultVariableName,
          char *inputVariableName)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\t");
  poVar1 = std::operator<<(poVar1,resultVariableName);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,inputVariableName);
  std::operator<<(poVar1,";\n");
  return;
}

Assistant:

void writeWorkload (std::ostringstream& dst, const char* resultVariableName, const char* inputVariableName) const
	{
		dst << "\t" << resultVariableName << " = " << inputVariableName << ";\n";
	}